

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

int StateGetHandSize(pyhanabi_state_t *state,int pid)

{
  const_reference pvVar1;
  
  if (state != (pyhanabi_state_t *)0x0) {
    pvVar1 = std::
             vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ::at((vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                   *)((long)state->state + 0x40),(long)pid);
    return (int)((ulong)((long)(pvVar1->cards_).
                               super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar1->cards_).
                              super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  __assert_fail("state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x19d,"int StateGetHandSize(pyhanabi_state_t *, int)");
}

Assistant:

int StateGetHandSize(pyhanabi_state_t* state, int pid) {
  REQUIRE(state != nullptr);
  return reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
      ->Hands()
      .at(pid)
      .Cards()
      .size();
}